

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<int,ft::allocator<int>>::remove_if<bool(*)(int_const&)>
          (list<int,ft::allocator<int>> *this,_func_bool_int_ptr *pred)

{
  bool bVar1;
  listNode<int> *plVar2;
  undefined1 local_50 [32];
  
  plVar2 = *(node **)(*(long *)this + 0x10);
  while (plVar2 != *(node **)(this + 8)) {
    bVar1 = (*pred)(&plVar2->data);
    if (bVar1) {
      local_50._16_8_ = &PTR__listIterator_0010dd60;
      local_50._24_8_ = plVar2;
      list<int,_ft::allocator<int>_>::erase
                ((list<int,_ft::allocator<int>_> *)local_50,(iterator *)this);
      plVar2 = (listNode<int> *)local_50._8_8_;
    }
    else {
      plVar2 = plVar2->next;
    }
  }
  return;
}

Assistant:

void remove_if(Predicate pred) {
		iterator	it = this->begin();
		while (it != this->end()) {
			if (pred(*it))
				it = this->erase(it);
			else
				++it;
		}
	}